

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

CompilationUnitSymbol * __thiscall slang::ast::Compilation::createScriptScope(Compilation *this)

{
  CompilationUnitSymbol *symbol;
  
  symbol = BumpAllocator::
           emplace<slang::ast::CompilationUnitSymbol,slang::ast::Compilation&,slang::SourceLibrary_const&>
                     (&this->super_BumpAllocator,this,this->defaultLibPtr);
  Scope::addMember(&((this->root)._M_t.
                     super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                     .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                    super_Scope,&symbol->super_Symbol);
  return symbol;
}

Assistant:

CompilationUnitSymbol& Compilation::createScriptScope() {
    SLANG_ASSERT(!isFrozen());

    auto unit = emplace<CompilationUnitSymbol>(*this, getDefaultLibrary());
    root->addMember(*unit);
    return *unit;
}